

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O1

void glist_doreload(_glist *gl,t_symbol *name,t_symbol *dir,t_gobj *except)

{
  ushort uVar1;
  bool bVar2;
  int iVar3;
  _glist *p_Var4;
  _glist *x;
  _glist *extraout_RAX;
  t_symbol *ptVar5;
  _glist *extraout_RAX_00;
  _glist *extraout_RAX_01;
  _glist *p_Var6;
  bool bVar7;
  
  uVar1 = *(ushort *)&gl->field_0xe8;
  p_Var4 = (_glist *)(ulong)uVar1;
  p_Var6 = (_glist *)gl->gl_list;
  if (p_Var6 != (_glist *)0x0) {
    bVar2 = false;
    do {
      bVar7 = false;
      if ((p_Var6 != (_glist *)except) && ((p_Var6->gl_obj).te_g.g_pd == canvas_class)) {
        iVar3 = canvas_isabstraction(p_Var6);
        bVar7 = false;
        if ((iVar3 != 0) && (p_Var6->gl_name == name)) {
          ptVar5 = canvas_getdir(p_Var6);
          bVar7 = ptVar5 == dir;
        }
      }
      p_Var4 = (_glist *)(p_Var6->gl_obj).te_g.g_pd;
      if (p_Var4 == (_glist *)clone_class) {
        iVar3 = clone_match((t_pd *)p_Var6,name,dir);
        p_Var4 = (_glist *)0x1;
        if (iVar3 != 0) {
          bVar7 = true;
        }
      }
      if (bVar7) {
        canvas_create_editor(gl);
        if ((gl->field_0xe8 & 1) == 0) {
          p_Var4 = glist_getcanvas(x);
          canvas_vis(p_Var4,1.0);
        }
        if (!bVar2) {
          glist_noselect(gl);
        }
        glist_select(gl,(t_gobj *)p_Var6);
        bVar2 = true;
        p_Var4 = extraout_RAX;
      }
      p_Var6 = (_glist *)(p_Var6->gl_obj).te_g.g_next;
    } while (p_Var6 != (_glist *)0x0);
    if (bVar2) {
      canvas_cut(gl);
      canvas_undo_undo(gl);
      canvas_undo_rebranch(gl);
      glist_noselect(gl);
      p_Var4 = extraout_RAX_00;
    }
  }
  for (p_Var6 = (_glist *)gl->gl_list; p_Var6 != (_glist *)0x0;
      p_Var6 = (_glist *)(p_Var6->gl_obj).te_g.g_next) {
    if (((p_Var6 != (_glist *)except) &&
        (p_Var4 = (_glist *)(p_Var6->gl_obj).te_g.g_pd, p_Var4 == (_glist *)canvas_class)) &&
       ((iVar3 = canvas_isabstraction(p_Var6), iVar3 == 0 ||
        ((p_Var6->gl_name != name ||
         (p_Var4 = (_glist *)canvas_getdir(p_Var6), p_Var4 != (_glist *)dir)))))) {
      glist_doreload(p_Var6,name,dir,except);
      p_Var4 = extraout_RAX_01;
    }
  }
  if (((uVar1 & 1) == 0) && ((gl->field_0xe8 & 1) != 0)) {
    p_Var6 = glist_getcanvas(p_Var4);
    canvas_vis(p_Var6,0.0);
    return;
  }
  return;
}

Assistant:

static void glist_doreload(t_glist *gl, t_symbol *name, t_symbol *dir,
    t_gobj *except)
{
    t_gobj *g;
    int hadwindow = gl->gl_havewindow;
    int found = 0;
        /* to optimize redrawing we select all objects that need to be updated
           and redraw (cut+undo) them together. Then we look for sub-patches that may have
           more of the same... */
    for (g = gl->gl_list; g; g = g->g_next)
    {
            /* remake the object if it's an abstraction that appears to have
               been loaded from the file we just saved */
        int remakeit = (g != except && pd_class(&g->g_pd) == canvas_class &&
            canvas_isabstraction((t_canvas *)g) &&
                ((t_canvas *)g)->gl_name == name &&
                    canvas_getdir((t_canvas *)g) == dir);
            /* also remake it if it's a "clone" with that name */
        if (pd_class(&g->g_pd) == clone_class &&
            clone_match(&g->g_pd, name, dir))
        {
                /* LATER try not to remake the one that equals "except" */
            remakeit = 1;
        }
        if (remakeit)
        {
                /* Bugfix for cases where canvas_vis doesn't actually create a
                   new editor. We need to fix canvas_vis so that the bug
                   doesn't get triggered. But since we know this fixes a
                   regression we'll keep this as a point in the history as we
                   fix canvas_vis. Once that's done we can remove this call. */
            canvas_create_editor(gl);

            if (!gl->gl_havewindow)
            {
                canvas_vis(glist_getcanvas(gl), 1);
            }
            if (!found)
            {
                glist_noselect(gl);
                found = 1;
            }
            glist_select(gl, g);
        }
    }
        /* cut all selected (matched) objects and undo, to reinstantiate them */
    if (found)
    {
        canvas_cut(gl);
        canvas_undo_undo(gl);
        canvas_undo_rebranch(gl);
        glist_noselect(gl);
    }

        /* now iterate over all the sub-patches... */
    for (g = gl->gl_list; g; g = g->g_next)
    {
        if (g != except && pd_class(&g->g_pd) == canvas_class &&
            (!canvas_isabstraction((t_canvas *)g) ||
                 ((t_canvas *)g)->gl_name != name ||
                 canvas_getdir((t_canvas *)g) != dir)
           )
                glist_doreload((t_canvas *)g, name, dir, except);
    }
    if (!hadwindow && gl->gl_havewindow)
        canvas_vis(glist_getcanvas(gl), 0);
}